

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O0

string_t duckdb::HexStrOperator::Operation<duckdb::string_t,duckdb::string_t>
                   (string_t input,Vector *result)

{
  string_t *this;
  idx_t iVar1;
  char *pcVar2;
  Vector *in_RDX;
  idx_t i;
  char *output;
  idx_t size;
  char *data;
  string_t target;
  ulong local_48;
  string_t *in_stack_ffffffffffffffc0;
  string_t local_20;
  anon_union_16_2_67f50693_for_value local_10;
  
  this = (string_t *)string_t::GetData(in_stack_ffffffffffffffc0);
  iVar1 = string_t::GetSize(&local_20);
  local_10 = (anon_union_16_2_67f50693_for_value)
             duckdb::StringVector::EmptyString(in_RDX,iVar1 << 1);
  pcVar2 = string_t::GetDataWriteable(in_stack_ffffffffffffffc0);
  for (local_48 = 0; local_48 < iVar1; local_48 = local_48 + 1) {
    *pcVar2 = "0123456789ABCDEF"[(int)((int)*(char *)((long)&this->value + local_48) >> 4 & 0xf)];
    pcVar2[1] = "0123456789ABCDEF"[(int)((int)*(char *)((long)&this->value + local_48) & 0xf)];
    pcVar2 = pcVar2 + 2;
  }
  string_t::Finalize(this);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_10.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto data = input.GetData();
		auto size = input.GetSize();

		// Allocate empty space
		auto target = StringVector::EmptyString(result, size * 2);
		auto output = target.GetDataWriteable();

		for (idx_t i = 0; i < size; ++i) {
			*output = Blob::HEX_TABLE[(data[i] >> 4) & 0x0F];
			output++;
			*output = Blob::HEX_TABLE[data[i] & 0x0F];
			output++;
		}

		target.Finalize();
		return target;
	}